

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

vm_obj_id_t CVmObjStringBuffer::create(int in_root_set,int32_t alo,int32_t inc)

{
  vm_obj_id_t obj_id;
  CVmObjStringBuffer *this;
  
  obj_id = vm_new_id(in_root_set,0,0);
  this = (CVmObjStringBuffer *)CVmObject::operator_new(0x10,obj_id);
  CVmObjStringBuffer(this,alo,inc);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjStringBuffer::create(VMG_ int in_root_set,
                                       int32_t alo, int32_t inc)
{
    /* allocate the object ID */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);

    /* create the C++ object */
    new (vmg_ id) CVmObjStringBuffer(vmg_ alo, inc);

    /* return the new ID */
    return id;
}